

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Organya.cpp
# Opt level: O0

void PlayOrganObject(uchar key,int mode,char track,long freq)

{
  long freq_local;
  char track_local;
  int mode_local;
  uchar key_local;
  
  if ((audio_backend_initialised) &&
     (lpORGANBUFFER[track][(int)(key / 0xc)][key_twin[track]] != (AudioBackend_Sound *)0x0)) {
    switch(mode) {
    case 0:
      if (old_key[track] != 0xff) {
        AudioBackend_StopSound(lpORGANBUFFER[track][(int)(old_key[track] / 0xc)][key_twin[track]]);
        AudioBackend_RewindSound(lpORGANBUFFER[track][(int)(old_key[track] / 0xc)][key_twin[track]])
        ;
      }
      break;
    case 1:
      break;
    case 2:
      if (old_key[track] != 0xff) {
        AudioBackend_PlaySound
                  (lpORGANBUFFER[track][(int)(old_key[track] / 0xc)][key_twin[track]],false);
        old_key[track] = 0xff;
      }
      break;
    case -1:
      if (old_key[track] == 0xff) {
        ChangeOrganFrequency(key % 0xc,track,freq);
        AudioBackend_PlaySound(lpORGANBUFFER[track][(int)(key / 0xc)][key_twin[track]],true);
        old_key[track] = key;
        key_on[track] = '\x01';
      }
      else if ((key_on[track] == '\x01') && (old_key[track] == key)) {
        AudioBackend_PlaySound
                  (lpORGANBUFFER[track][(int)(old_key[track] / 0xc)][key_twin[track]],false);
        key_twin[track] = key_twin[track] + '\x01';
        if (1 < key_twin[track]) {
          key_twin[track] = '\0';
        }
        AudioBackend_PlaySound(lpORGANBUFFER[track][(int)(key / 0xc)][key_twin[track]],true);
      }
      else {
        AudioBackend_PlaySound
                  (lpORGANBUFFER[track][(int)(old_key[track] / 0xc)][key_twin[track]],false);
        key_twin[track] = key_twin[track] + '\x01';
        if (1 < key_twin[track]) {
          key_twin[track] = '\0';
        }
        ChangeOrganFrequency(key % 0xc,track,freq);
        AudioBackend_PlaySound(lpORGANBUFFER[track][(int)(key / 0xc)][key_twin[track]],true);
        old_key[track] = key;
      }
    }
  }
  return;
}

Assistant:

void PlayOrganObject(unsigned char key, int mode, signed char track, long freq)
{
	if (!audio_backend_initialised)
		return;

	if (lpORGANBUFFER[track][key / 12][key_twin[track]] != NULL)
	{
		switch (mode)
		{
			case 0:	// 停止 (Stop)
				if (old_key[track] != 0xFF)
				{
					AudioBackend_StopSound(lpORGANBUFFER[track][old_key[track] / 12][key_twin[track]]);
					AudioBackend_RewindSound(lpORGANBUFFER[track][old_key[track] / 12][key_twin[track]]);
				}
				break;

			case 1: // 再生 (Playback)
				break;

			case 2:	// 歩かせ停止 (Stop playback)
				if (old_key[track] != 0xFF)
				{
					AudioBackend_PlaySound(lpORGANBUFFER[track][old_key[track] / 12][key_twin[track]], FALSE);
					old_key[track] = 0xFF;
				}
				break;

			case -1:
				if (old_key[track] == 0xFF)	// 新規鳴らす (New sound)
				{
					ChangeOrganFrequency(key % 12, track, freq);	// 周波数を設定して (Set the frequency)
					AudioBackend_PlaySound(lpORGANBUFFER[track][key / 12][key_twin[track]], TRUE);
					old_key[track] = key;
					key_on[track] = 1;
				}
				else if (key_on[track] == 1 && old_key[track] == key)	// 同じ音 (Same sound)
				{
					// 今なっているのを歩かせ停止 (Stop playback now)
					AudioBackend_PlaySound(lpORGANBUFFER[track][old_key[track] / 12][key_twin[track]], FALSE);
					key_twin[track]++;
					if (key_twin[track] > 1)
						key_twin[track] = 0;
					AudioBackend_PlaySound(lpORGANBUFFER[track][key / 12][key_twin[track]], TRUE);
				}
				else	// 違う音を鳴らすなら (If you make a different sound)
				{
					AudioBackend_PlaySound(lpORGANBUFFER[track][old_key[track] / 12][key_twin[track]], FALSE);	// 今なっているのを歩かせ停止 (Stop playback now)
					key_twin[track]++;
					if (key_twin[track] > 1)
						key_twin[track] = 0;
					ChangeOrganFrequency(key % 12, track, freq);	// 周波数を設定して (Set the frequency)
					AudioBackend_PlaySound(lpORGANBUFFER[track][key / 12][key_twin[track]], TRUE);
					old_key[track] = key;
				}

				break;
		}
	}
}